

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

Tensor<std::complex<double>_> * __thiscall
scp::Tensor<std::complex<double>>::operator/=
          (Tensor<std::complex<double>> *this,complex<double> *scalar)

{
  long lVar1;
  long lVar2;
  complex<double> *valuesEnd;
  complex<double> *values;
  complex<double> *scalar_local;
  Tensor<std::complex<double>_> *this_local;
  
  lVar1 = *(long *)(this + 0x20);
  lVar2 = *(long *)(this + 0x18);
  for (valuesEnd = *(complex<double> **)(this + 0x20);
      valuesEnd != (complex<double> *)(lVar1 + lVar2 * 0x10); valuesEnd = valuesEnd + 1) {
    std::complex<double>::operator/=(valuesEnd,scalar);
  }
  return (Tensor<std::complex<double>_> *)this;
}

Assistant:

constexpr Tensor<TValue>& Tensor<TValue>::operator/=(const TScalar& scalar)
	{
		TValue* values = _values;
		const TValue* const valuesEnd = _values + _length;

		for (; values != valuesEnd; ++values)
		{
			*values /= scalar;
		}

		return *this;
	}